

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  bool bVar1;
  bool bVar2;
  ImVec2 in_RSI;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffff68;
  ImDrawList *pIVar3;
  ImGuiMouseButton in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar4;
  ImGuiWindow *window_00;
  ImGuiID in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  byte local_52;
  byte local_51;
  undefined1 local_48 [16];
  ImVec2 local_38;
  float in_stack_ffffffffffffffd4;
  ImVec2 in_stack_ffffffffffffffd8;
  ImVec2 out_hovered;
  ImVec2 IVar5;
  float fVar6;
  ImVec2 bb_00;
  
  out_hovered = (ImVec2)GImGui->CurrentWindow;
  window_00 = (ImGuiWindow *)local_48;
  IVar5 = (ImVec2)GImGui;
  bb_00 = in_RSI;
  ImVec2::ImVec2((ImVec2 *)window_00,GImGui->FontSize,GImGui->FontSize);
  fVar6 = IVar5.y;
  local_48._8_8_ = ::operator+(&in_stack_ffffffffffffff68->Min,(ImVec2 *)0x4f41da);
  ::operator*(&in_stack_ffffffffffffff68->Min,0.0);
  local_38 = ::operator+(&in_stack_ffffffffffffff68->Min,(ImVec2 *)0x4f4211);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffd0,(ImVec2 *)in_RSI,&local_38);
  ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
          in_stack_ffffffffffffff94,(ImRect *)in_RSI,(ImGuiItemFlags)((ulong)window_00 >> 0x20));
  bVar1 = ButtonBehavior((ImRect *)bb_00,(ImGuiID)fVar6,(bool *)out_hovered,
                         (bool *)in_stack_ffffffffffffffd8,
                         (ImGuiButtonFlags)in_stack_ffffffffffffffd4);
  if (((local_52 & 1) == 0) || ((local_51 & 1) == 0)) {
    uVar4 = 0x15;
    if ((local_51 & 1) != 0) {
      uVar4 = 0x16;
    }
  }
  else {
    uVar4 = 0x17;
  }
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  if (((local_51 & 1) != 0) || ((local_52 & 1) != 0)) {
    pIVar3 = *(ImDrawList **)((long)out_hovered + 0x278);
    ImRect::GetCenter(in_stack_ffffffffffffff68);
    ImDrawList::AddCircleFilled
              ((ImDrawList *)window_00,(ImVec2 *)CONCAT44(uVar4,in_stack_ffffffffffffff78),
               (float)((ulong)pIVar3 >> 0x20),(ImU32)pIVar3,
               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    in_stack_ffffffffffffff70 = (ImGuiMouseButton)pIVar3;
  }
  pIVar3 = *(ImDrawList **)((long)out_hovered + 0x278);
  ::operator+((ImVec2 *)pIVar3,(ImVec2 *)0x4f4357);
  fVar6 = (float)((ulong)pIVar3 >> 0x20);
  RenderArrow((ImDrawList *)window,(ImVec2)g,(ImU32)bb.Max.y,(ImGuiDir)bb.Max.x,bb.Min.y);
  bVar2 = IsItemActive();
  if ((bVar2) && (bVar2 = IsMouseDragging(in_stack_ffffffffffffff70,fVar6), bVar2)) {
    StartMouseMovingWindow(window_00);
  }
  return bVar1;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    if (hovered || held)
        window->DrawList->AddCircleFilled(bb.GetCenter()/*+ ImVec2(0.0f, -0.5f)*/, g.FontSize * 0.5f + 1.0f, bg_col, 12);
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}